

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void __thiscall
spdlog::logger::log_<fmt::v6::basic_string_view<char>,std::__cxx11::string,std::__cxx11::string>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  log_msg log_msg;
  undefined **local_1b8;
  char *local_1b0;
  size_t sStack_1a8;
  ulong local_1a0;
  char local_198 [256];
  undefined1 local_98 [24];
  time_point tStack_80;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_1b0 = local_198;
    sStack_1a8 = 0;
    local_1b8 = &PTR_grow_001b51d8;
    local_1a0 = 0xfa;
    local_98._0_8_ = (args->_M_dataplus)._M_p;
    local_98._8_8_ = args->_M_string_length;
    local_98._16_8_ = (args_1->_M_dataplus)._M_p;
    tStack_80.__d.__r = (duration)args_1->_M_string_length;
    args_00.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_98;
    args_00.types_ = 0x1ce;
    ::fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)&local_1b8,*fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = sStack_1a8;
    msg.data_ = local_1b0;
    details::log_msg::log_msg((log_msg *)local_98,loc,a_logger_name,lvl,msg);
    log_it_(this,(log_msg *)local_98,iVar1 <= (int)lvl,traceback_enabled);
    local_1b8 = &PTR_grow_001b51d8;
    if (local_1b0 != local_198) {
      operator_delete(local_1b0,local_1a0);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }